

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmMakefile *this_00;
  cmTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  ostream *poVar4;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  this_00 = this->Target->Target->Makefile;
  bVar1 = cmMakefile::PlatformIsAppleIos(this_00);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"XCODE",(allocator *)&local_50);
    bVar1 = cmMakefile::IsOn(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_70,"XCODE_VERSION",(allocator *)&local_50);
      pcVar3 = cmMakefile::GetDefinition(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_70,"6",&local_71);
        std::__cxx11::string::string((string *)&local_50,pcVar3,&local_72);
        bVar1 = cmSystemTools::VersionCompareGreater(&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        if (!bVar1) {
          TVar2 = cmGeneratorTarget::GetType(this->Target);
          if (TVar2 < OBJECT_LIBRARY) {
            this_01 = this->Target->Target;
            std::__cxx11::string::string
                      ((string *)&local_70,"IOS_INSTALL_COMBINED",(allocator *)&local_50);
            bVar1 = cmTarget::GetPropertyAsBool(this_01,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            if (bVar1) {
              poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
              std::operator<<(poVar4,"include(CMakeIOSInstallCombined)\n");
              poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
              poVar4 = std::operator<<(poVar4,"ios_install_combined(");
              poVar4 = std::operator<<(poVar4,"\"");
              poVar4 = std::operator<<(poVar4,(string *)&this->Target->Target->Name);
              poVar4 = std::operator<<(poVar4,"\" ");
              poVar4 = std::operator<<(poVar4,"\"");
              poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
              std::operator<<(poVar4,"\")\n");
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleIos() || !mf->IsOn("XCODE")) {
    return;
  }

  const char* xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}